

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema_compile_amend.c
# Opt level: O3

LY_ERR lys_precompile_own_augments_mod(lysc_ctx *ctx,lysp_module *pmod)

{
  lysp_ext_instance *plVar1;
  lysp_ext_substmt *plVar2;
  lysp_ext_substmt *plVar3;
  LY_ERR LVar4;
  lysp_ext_instance *plVar5;
  void **ppvVar6;
  lysp_ext_substmt *plVar7;
  void **ppvVar8;
  lysp_node_augment *aug_p;
  lysp_ext_instance *plVar9;
  
  for (aug_p = pmod->augments; aug_p != (lysp_node_augment *)0x0;
      aug_p = (aug_p->field_0).field_1.next) {
    LVar4 = lys_precompile_own_augment(ctx,aug_p,pmod,(lysp_ext_instance *)0x0);
    if (LVar4 != LY_SUCCESS) {
      return LVar4;
    }
  }
  plVar9 = (lysp_ext_instance *)0x0;
  do {
    plVar1 = pmod->exts;
    if (plVar1 == (lysp_ext_instance *)0x0) {
      plVar5 = (lysp_ext_instance *)0x0;
    }
    else {
      plVar5 = plVar1[-1].exts;
    }
    if (plVar5 <= plVar9) {
      return LY_SUCCESS;
    }
    plVar2 = plVar1[(long)plVar9].substmts;
    ppvVar6 = (void **)0xffffffffffffffff;
    plVar3 = plVar2;
    do {
      plVar7 = plVar3;
      if (plVar2 == (lysp_ext_substmt *)0x0) {
        ppvVar8 = (void **)0x0;
      }
      else {
        ppvVar8 = plVar2[-1].storage_p;
      }
      ppvVar6 = (void **)((long)ppvVar6 + 1);
      if (ppvVar8 <= ppvVar6) goto LAB_001510a7;
      plVar3 = plVar7 + 1;
    } while (plVar7->stmt != LY_STMT_AUGMENT);
    if (((lysp_node_augment *)*plVar7->storage_p != (lysp_node_augment *)0x0) &&
       (LVar4 = lys_precompile_own_augment
                          (ctx,(lysp_node_augment *)*plVar7->storage_p,pmod,plVar1 + (long)plVar9),
       LVar4 != LY_SUCCESS)) {
      return LVar4;
    }
LAB_001510a7:
    plVar9 = (lysp_ext_instance *)((long)&plVar9->name + 1);
  } while( true );
}

Assistant:

static LY_ERR
lys_precompile_own_augments_mod(struct lysc_ctx *ctx, const struct lysp_module *pmod)
{
    LY_ARRAY_COUNT_TYPE u, v;
    struct lysp_node_augment *aug_p;

    /* module */
    LY_LIST_FOR(pmod->augments, aug_p) {
        LY_CHECK_RET(lys_precompile_own_augment(ctx, aug_p, pmod, NULL));
    }

    /* parsed extension instances */
    LY_ARRAY_FOR(pmod->exts, u) {
        aug_p = NULL;
        LY_ARRAY_FOR(pmod->exts[u].substmts, v) {
            if (pmod->exts[u].substmts[v].stmt == LY_STMT_AUGMENT) {
                aug_p = *(pmod->exts[u].substmts[v].storage_p);
                break;
            }
        }
        if (!aug_p) {
            continue;
        }

        LY_CHECK_RET(lys_precompile_own_augment(ctx, aug_p, pmod, &pmod->exts[u]));
    }

    return LY_SUCCESS;
}